

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geomCallback(sqlite3_context *ctx,int nArg,sqlite3_value **aArg)

{
  sqlite3_context *pCtx;
  char *zPType;
  undefined4 *pPtr;
  sqlite3_value *psVar1;
  int in_ESI;
  sqlite3_context *in_RDI;
  double dVar2;
  int i;
  int memErr;
  sqlite3_int64 nBlob;
  RtreeMatchArg *pBlob;
  RtreeGeomCallback *pGeomCtx;
  uint in_stack_ffffffffffffffc8;
  uint uVar3;
  int iVar4;
  
  pCtx = (sqlite3_context *)sqlite3_user_data(in_RDI);
  iVar4 = 0;
  zPType = (char *)((long)(in_ESI + -1) * 8 + 0x40 + (long)in_ESI * 8);
  pPtr = (undefined4 *)sqlite3_malloc64((ulong)in_stack_ffffffffffffffc8);
  if (pPtr == (undefined4 *)0x0) {
    sqlite3_result_error_nomem((sqlite3_context *)0x151e8e);
  }
  else {
    *pPtr = (int)zPType;
    *(Mem **)(pPtr + 2) = pCtx->pOut;
    *(FuncDef **)(pPtr + 4) = pCtx->pFunc;
    *(Mem **)(pPtr + 6) = pCtx->pMem;
    *(Vdbe **)(pPtr + 8) = pCtx->pVdbe;
    *(undefined4 **)(pPtr + 0xc) = pPtr + (long)in_ESI * 2 + 0xe;
    pPtr[10] = in_ESI;
    for (uVar3 = 0; (int)uVar3 < in_ESI; uVar3 = uVar3 + 1) {
      psVar1 = sqlite3_value_dup((sqlite3_value *)CONCAT44(iVar4,uVar3));
      *(sqlite3_value **)(*(long *)(pPtr + 0xc) + (long)(int)uVar3 * 8) = psVar1;
      if (*(long *)(*(long *)(pPtr + 0xc) + (long)(int)uVar3 * 8) == 0) {
        iVar4 = 1;
      }
      dVar2 = sqlite3_value_double((sqlite3_value *)0x151f5f);
      *(double *)(pPtr + (long)(int)uVar3 * 2 + 0xe) = dVar2;
    }
    if (iVar4 == 0) {
      sqlite3_result_pointer(pCtx,pPtr,zPType,(_func_void_void_ptr *)(ulong)uVar3);
    }
    else {
      sqlite3_result_error_nomem((sqlite3_context *)0x151f8a);
      rtreeMatchArgFree(zPType);
    }
  }
  return;
}

Assistant:

static void geomCallback(sqlite3_context *ctx, int nArg, sqlite3_value **aArg){
  RtreeGeomCallback *pGeomCtx = (RtreeGeomCallback *)sqlite3_user_data(ctx);
  RtreeMatchArg *pBlob;
  sqlite3_int64 nBlob;
  int memErr = 0;

  nBlob = sizeof(RtreeMatchArg) + (nArg-1)*sizeof(RtreeDValue)
           + nArg*sizeof(sqlite3_value*);
  pBlob = (RtreeMatchArg *)sqlite3_malloc64(nBlob);
  if( !pBlob ){
    sqlite3_result_error_nomem(ctx);
  }else{
    int i;
    pBlob->iSize = nBlob;
    pBlob->cb = pGeomCtx[0];
    pBlob->apSqlParam = (sqlite3_value**)&pBlob->aParam[nArg];
    pBlob->nParam = nArg;
    for(i=0; i<nArg; i++){
      pBlob->apSqlParam[i] = sqlite3_value_dup(aArg[i]);
      if( pBlob->apSqlParam[i]==0 ) memErr = 1;
#ifdef SQLITE_RTREE_INT_ONLY
      pBlob->aParam[i] = sqlite3_value_int64(aArg[i]);
#else
      pBlob->aParam[i] = sqlite3_value_double(aArg[i]);
#endif
    }
    if( memErr ){
      sqlite3_result_error_nomem(ctx);
      rtreeMatchArgFree(pBlob);
    }else{
      sqlite3_result_pointer(ctx, pBlob, "RtreeMatchArg", rtreeMatchArgFree);
    }
  }
}